

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

unsigned_long_long ncr(int n,int k)

{
  unsigned_long_long d;
  unsigned_long_long r;
  int k_local;
  int n_local;
  undefined8 local_8;
  
  if (n < k) {
    local_8 = 0;
  }
  else {
    r = 1;
    n_local = n;
    for (d = 1; d <= (ulong)(long)k; d = d + 1) {
      r = ((long)n_local * r) / d;
      n_local = n_local + -1;
    }
    local_8 = r;
  }
  return local_8;
}

Assistant:

unsigned long long
ncr(int n, int k) {
    if (k > n) {
        return 0;
    }
    unsigned long long r = 1;
    for (unsigned long long d = 1; d <= k; ++d) {
        r *= n--;
        r /= d;
    }
    return r;
}